

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

VariableP<float> __thiscall
vkt::shaderexecutor::ExpandContext::genSym<float>(ExpandContext *this,string *baseName)

{
  int *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  VariableP<float> VVar2;
  int local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  piVar1 = (int *)(baseName->_M_dataplus)._M_p;
  local_5c = *piVar1;
  *piVar1 = local_5c + 1;
  de::toString<int>(&local_38,&local_5c);
  std::operator+(&local_58,in_RDX,&local_38);
  variable<float>((shaderexecutor *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state = extraout_RDX;
  VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr = (Variable<float> *)this
  ;
  return (VariableP<float>)VVar2.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>;
}

Assistant:

VariableP<T>		genSym			(const string& baseName)
	{
		return variable<T>(baseName + de::toString(m_symCounter()));
	}